

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<float>::make_l2_norm(default_cost_type<float> *this,int n)

{
  float *pfVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  ushort uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  if (n != 0) {
    auVar28 = ZEXT816(0) << 0x40;
    uVar20 = 0;
    do {
      pfVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar20;
      uVar20 = uVar20 + 1;
      auVar29 = ZEXT416((uint)*pfVar2);
      auVar28 = vfmadd231ss_fma(auVar28,auVar29,auVar29);
    } while ((uint)n != uVar20);
    uVar19 = auVar28._0_4_ & 0x7fffffff;
    if ((uVar19 < 0x7f800001 && n != 0) &&
        (0x7ffffe < uVar19 - 1 && (uVar19 != 0x7f800000 && auVar28._0_4_ != 0))) {
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pfVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      auVar24 = vbroadcastss_avx512f(auVar28);
      auVar25 = vpbroadcastq_avx512f();
      uVar20 = 0;
      do {
        auVar26 = vpbroadcastq_avx512f();
        auVar27 = vporq_avx512f(auVar26,auVar22);
        auVar26 = vporq_avx512f(auVar26,auVar23);
        uVar16 = vpcmpuq_avx512f(auVar26,auVar25,2);
        bVar17 = (byte)uVar16;
        uVar16 = vpcmpuq_avx512f(auVar27,auVar25,2);
        bVar18 = (byte)uVar16;
        uVar21 = CONCAT11(bVar18,bVar17);
        pfVar1 = pfVar2 + uVar20;
        auVar26._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * (int)pfVar1[1];
        auVar26._0_4_ = (uint)(bVar17 & 1) * (int)*pfVar1;
        auVar26._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * (int)pfVar1[2];
        auVar26._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * (int)pfVar1[3];
        auVar26._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * (int)pfVar1[4];
        auVar26._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * (int)pfVar1[5];
        auVar26._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * (int)pfVar1[6];
        auVar26._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * (int)pfVar1[7];
        auVar26._32_4_ = (uint)(bVar18 & 1) * (int)pfVar1[8];
        auVar26._36_4_ = (uint)(bVar18 >> 1 & 1) * (int)pfVar1[9];
        auVar26._40_4_ = (uint)(bVar18 >> 2 & 1) * (int)pfVar1[10];
        auVar26._44_4_ = (uint)(bVar18 >> 3 & 1) * (int)pfVar1[0xb];
        auVar26._48_4_ = (uint)(bVar18 >> 4 & 1) * (int)pfVar1[0xc];
        auVar26._52_4_ = (uint)(bVar18 >> 5 & 1) * (int)pfVar1[0xd];
        auVar26._56_4_ = (uint)(bVar18 >> 6 & 1) * (int)pfVar1[0xe];
        auVar26._60_4_ = (uint)(bVar18 >> 7) * (int)pfVar1[0xf];
        auVar26 = vdivps_avx512f(auVar26,auVar24);
        pfVar1 = pfVar2 + uVar20;
        bVar3 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar21 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar21 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar21 >> 6) & 1);
        bVar9 = (bool)((byte)(uVar21 >> 7) & 1);
        bVar10 = (bool)(bVar18 >> 1 & 1);
        bVar11 = (bool)(bVar18 >> 2 & 1);
        bVar12 = (bool)(bVar18 >> 3 & 1);
        bVar13 = (bool)(bVar18 >> 4 & 1);
        bVar14 = (bool)(bVar18 >> 5 & 1);
        bVar15 = (bool)(bVar18 >> 6 & 1);
        *pfVar1 = (float)((uint)(bVar17 & 1) * auVar26._0_4_ |
                         (uint)!(bool)(bVar17 & 1) * (int)*pfVar1);
        pfVar1[1] = (float)((uint)bVar3 * auVar26._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
        pfVar1[2] = (float)((uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
        pfVar1[3] = (float)((uint)bVar5 * auVar26._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
        pfVar1[4] = (float)((uint)bVar6 * auVar26._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
        pfVar1[5] = (float)((uint)bVar7 * auVar26._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
        pfVar1[6] = (float)((uint)bVar8 * auVar26._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
        pfVar1[7] = (float)((uint)bVar9 * auVar26._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
        pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar26._32_4_ |
                           (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
        pfVar1[9] = (float)((uint)bVar10 * auVar26._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
        pfVar1[10] = (float)((uint)bVar11 * auVar26._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
        pfVar1[0xb] = (float)((uint)bVar12 * auVar26._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]);
        pfVar1[0xc] = (float)((uint)bVar13 * auVar26._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]);
        pfVar1[0xd] = (float)((uint)bVar14 * auVar26._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]);
        pfVar1[0xe] = (float)((uint)bVar15 * auVar26._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]);
        pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar26._60_4_ |
                             (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
        uVar20 = uVar20 + 0x10;
      } while (((ulong)(uint)n + 0xf & 0xfffffffffffffff0) != uVar20);
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }